

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<double>_>::AddSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<Fad<double>_> *pA)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  int sz;
  int64_t iVar8;
  int64_t iVar9;
  long local_c0;
  Fad<double> local_b8;
  long local_98;
  int64_t local_90;
  long local_88;
  TPZMatrix<Fad<double>_> *local_80;
  long local_78;
  Fad<double> local_70;
  Fad<double> local_50;
  
  local_98 = pRow + rowSize;
  local_90 = sCol;
  local_80 = this;
  if (((pA->super_TPZBaseMatrix).fRow < local_98) ||
     ((pA->super_TPZBaseMatrix).fCol < colSize + pCol)) {
    Error("AddSub <the sub-matrix is too big that target>",(char *)0x0);
  }
  if (0 < rowSize) {
    local_88 = colSize + pCol;
    local_c0 = sRow;
    do {
      iVar8 = pCol;
      iVar9 = local_90;
      local_78 = pRow;
      if (0 < colSize) {
        do {
          (*(local_80->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,local_80,local_c0,iVar9);
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_70,pA,pRow);
          iVar3 = local_50.dx_.num_elts;
          iVar2 = local_70.dx_.num_elts;
          local_b8.val_ = local_50.val_ + local_70.val_;
          uVar1 = local_70.dx_.num_elts;
          if (local_70.dx_.num_elts < local_50.dx_.num_elts) {
            uVar1 = local_50.dx_.num_elts;
          }
          local_b8.dx_.num_elts = 0;
          local_b8.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar1) {
            uVar7 = (ulong)uVar1;
            local_b8.dx_.num_elts = uVar1;
            local_b8.dx_.ptr_to_data = (double *)operator_new__(uVar7 * 8);
            if (0 < (int)uVar1) {
              lVar4 = 0;
              do {
                pdVar5 = (double *)((long)local_50.dx_.ptr_to_data + lVar4);
                if (iVar3 == 0) {
                  pdVar5 = &local_50.defaultVal;
                }
                pdVar6 = (double *)((long)local_70.dx_.ptr_to_data + lVar4);
                if (iVar2 == 0) {
                  pdVar6 = &local_70.defaultVal;
                }
                *(double *)((long)local_b8.dx_.ptr_to_data + lVar4) = *pdVar5 + *pdVar6;
                lVar4 = lVar4 + 8;
                uVar7 = uVar7 - 1;
              } while (uVar7 != 0);
            }
          }
          pRow = local_78;
          local_b8.defaultVal = 0.0;
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (pA,local_78,iVar8,&local_b8);
          Fad<double>::~Fad(&local_b8);
          Fad<double>::~Fad(&local_70);
          Fad<double>::~Fad(&local_50);
          iVar8 = iVar8 + 1;
          iVar9 = iVar9 + 1;
        } while (iVar8 < local_88);
      }
      pRow = pRow + 1;
      local_c0 = local_c0 + 1;
    } while (pRow < local_98);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}